

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mzd_additional.c
# Opt level: O2

void mzd_mul_v_s128_256_1280(mzd_local_t *c,mzd_local_t *v,mzd_local_t *A)

{
  undefined1 auVar1 [64];
  int iVar2;
  int iVar3;
  long lVar4;
  bool bVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [64];
  undefined1 local_b8 [64];
  word local_78;
  word wStack_70;
  word local_68;
  word wStack_60;
  word local_58;
  word wStack_50;
  word wStack_48;
  word wStack_40;
  word wStack_38;
  word wStack_30;
  word wStack_28;
  word wStack_20;
  
  auVar8 = ZEXT1664((undefined1  [16])0x0);
  iVar2 = 4;
  auVar1 = vmovdqu64_avx512f(auVar8);
  wStack_38 = auVar1._32_8_;
  wStack_30 = auVar1._40_8_;
  wStack_28 = auVar1._48_8_;
  wStack_20 = auVar1._56_8_;
  auVar1 = vmovdqu64_avx512f(auVar8);
  local_78 = auVar1._0_8_;
  wStack_70 = auVar1._8_8_;
  local_68 = auVar1._16_8_;
  wStack_60 = auVar1._24_8_;
  local_58 = auVar1._32_8_;
  wStack_50 = auVar1._40_8_;
  wStack_48 = auVar1._48_8_;
  wStack_40 = auVar1._56_8_;
  local_b8 = vmovdqu64_avx512f(auVar8);
  while (bVar5 = iVar2 != 0, iVar2 = iVar2 + -1, bVar5) {
    iVar3 = 0x40;
    while (bVar5 = iVar3 != 0, iVar3 = iVar3 + -1, bVar5) {
      auVar6 = vpbroadcastq_avx512vl();
      for (lVar4 = 0; lVar4 != 0x20; lVar4 = lVar4 + 0x10) {
        auVar7 = vpternlogq_avx512vl(*(undefined1 (*) [16])((long)A->w64 + lVar4),auVar6,
                                     *(undefined1 (*) [16])(local_b8 + lVar4),0x6a);
        *(undefined1 (*) [16])(local_b8 + lVar4) = auVar7;
      }
      for (lVar4 = 0x20; lVar4 != 0x40; lVar4 = lVar4 + 0x10) {
        auVar7 = vpternlogq_avx512vl(*(undefined1 (*) [16])((long)A->w64 + lVar4),auVar6,
                                     *(undefined1 (*) [16])(local_b8 + lVar4),0x6a);
        *(undefined1 (*) [16])(local_b8 + lVar4) = auVar7;
      }
      for (lVar4 = 0x40; lVar4 != 0x60; lVar4 = lVar4 + 0x10) {
        auVar7 = vpternlogq_avx512vl(*(undefined1 (*) [16])((long)A->w64 + lVar4),auVar6,
                                     *(undefined1 (*) [16])(local_b8 + lVar4),0x6a);
        *(undefined1 (*) [16])(local_b8 + lVar4) = auVar7;
      }
      for (lVar4 = 0x60; lVar4 != 0x80; lVar4 = lVar4 + 0x10) {
        auVar7 = vpternlogq_avx512vl(*(undefined1 (*) [16])((long)A->w64 + lVar4),auVar6,
                                     *(undefined1 (*) [16])(local_b8 + lVar4),0x6a);
        *(undefined1 (*) [16])(local_b8 + lVar4) = auVar7;
      }
      for (lVar4 = 0x80; lVar4 != 0xa0; lVar4 = lVar4 + 0x10) {
        auVar7 = vpternlogq_avx512vl(*(undefined1 (*) [16])((long)A->w64 + lVar4),auVar6,
                                     *(undefined1 (*) [16])(local_b8 + lVar4),0x6a);
        *(undefined1 (*) [16])(local_b8 + lVar4) = auVar7;
      }
      A = A + 5;
    }
  }
  c->w64[0] = local_b8._0_8_;
  c->w64[1] = local_b8._8_8_;
  c->w64[2] = local_b8._16_8_;
  c->w64[3] = local_b8._24_8_;
  c[1].w64[0] = local_b8._32_8_;
  c[1].w64[1] = local_b8._40_8_;
  c[1].w64[2] = local_b8._48_8_;
  c[1].w64[3] = local_b8._56_8_;
  c[2].w64[0] = local_78;
  c[2].w64[1] = wStack_70;
  c[2].w64[2] = local_68;
  c[2].w64[3] = wStack_60;
  c[3].w64[0] = local_58;
  c[3].w64[1] = wStack_50;
  c[3].w64[2] = wStack_48;
  c[3].w64[3] = wStack_40;
  c[4].w64[0] = wStack_38;
  c[4].w64[1] = wStack_30;
  c[4].w64[2] = wStack_28;
  c[4].w64[3] = wStack_20;
  return;
}

Assistant:

ATTR_TARGET_S128
void mzd_mul_v_s128_256_1280(mzd_local_t* c, mzd_local_t const* v, mzd_local_t const* A) {
  const word* vptr      = CONST_BLOCK(v, 0)->w64;
  const block_t* Ablock = CONST_BLOCK(A, 0);

  word128 cval[10] = {mm128_zero, mm128_zero, mm128_zero, mm128_zero, mm128_zero,
                      mm128_zero, mm128_zero, mm128_zero, mm128_zero, mm128_zero};
  for (unsigned int w = 4; w; --w, ++vptr) {
    word idx = *vptr;
    for (unsigned int i = sizeof(word) * 8; i; i -= 1, idx >>= 1, Ablock += 5) {
      const word128 mask = mm128_compute_mask(idx, 0);
      mm128_xor_mask_region(&cval[0], Ablock[0].w64, mask, 2);
      mm128_xor_mask_region(&cval[2], Ablock[1].w64, mask, 2);
      mm128_xor_mask_region(&cval[4], Ablock[2].w64, mask, 2);
      mm128_xor_mask_region(&cval[6], Ablock[3].w64, mask, 2);
      mm128_xor_mask_region(&cval[8], Ablock[4].w64, mask, 2);
    }
  }

  block_t* cblock1 = BLOCK(c, 0);
  block_t* cblock2 = BLOCK(c, 1);
  block_t* cblock3 = BLOCK(c, 2);
  block_t* cblock4 = BLOCK(c, 3);
  block_t* cblock5 = BLOCK(c, 4);
  mm128_store(&cblock1->w64[0], cval[0]);
  mm128_store(&cblock1->w64[2], cval[1]);
  mm128_store(&cblock2->w64[0], cval[2]);
  mm128_store(&cblock2->w64[2], cval[3]);
  mm128_store(&cblock3->w64[0], cval[4]);
  mm128_store(&cblock3->w64[2], cval[5]);
  mm128_store(&cblock4->w64[0], cval[6]);
  mm128_store(&cblock4->w64[2], cval[7]);
  mm128_store(&cblock5->w64[0], cval[8]);
  mm128_store(&cblock5->w64[2], cval[9]);
}